

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<char>::insert
          (QPodArrayOps<char> *this,qsizetype i,qsizetype n,parameter_type t)

{
  char *pcVar1;
  GrowthPosition where;
  long lVar2;
  
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<char>).size != 0);
  QArrayDataPointer<char>::detachAndGrow
            (&this->super_QArrayDataPointer<char>,where,n,(char **)0x0,
             (QArrayDataPointer<char> *)0x0);
  pcVar1 = createHole(this,where,i,n);
  for (lVar2 = 0; n != lVar2; lVar2 = lVar2 + 1) {
    pcVar1[lVar2] = t;
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        while (n--)
            *where++ = copy;
    }